

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O1

char * __cxxabiv1::anon_unknown_0::parse_conversion_expr<__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *paVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  *this;
  pointer psVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  tmp;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_130;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  *local_f0;
  undefined8 local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
  local_e0;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_d0;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_90;
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  local_70;
  
  if (((2 < (long)last - (long)first) && (*first == 'c')) && (first[1] == 'v')) {
    bVar8 = db->try_to_parse_template_args;
    db->try_to_parse_template_args = false;
    pcVar6 = first + 2;
    pcVar3 = parse_type<__cxxabiv1::(anonymous_namespace)::Db>(pcVar6,last,db);
    db->try_to_parse_template_args = bVar8;
    if (pcVar3 != last && pcVar3 != pcVar6) {
      if (*pcVar3 == '_') {
        pcVar3 = pcVar3 + 1;
        if (pcVar3 == last) {
          return first;
        }
        if (*pcVar3 == 'E') {
          std::
          vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
          ::emplace_back<>(&db->names);
        }
        else {
          do {
            cVar2 = *pcVar3;
            pcVar7 = pcVar6;
            if (cVar2 == 'E') break;
            pcVar4 = parse_expression<__cxxabiv1::(anonymous_namespace)::Db>(pcVar3,last,db);
            bVar8 = pcVar4 != pcVar3;
            if (pcVar4 != last) {
              pcVar3 = pcVar4;
            }
            pcVar7 = first;
          } while (pcVar4 != last && bVar8);
          if (cVar2 != 'E') {
            return pcVar7;
          }
        }
        pcVar6 = pcVar3 + 1;
      }
      else {
        pcVar6 = parse_expression<__cxxabiv1::(anonymous_namespace)::Db>(pcVar3,last,db);
        if (pcVar6 == pcVar3) {
          return first;
        }
      }
      psVar5 = (db->names).
               super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (0x40 < (ulong)((long)psVar5 -
                        (long)(db->names).
                              super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        this = psVar5 + -1;
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::move_full(&local_90,this);
        psVar5 = (db->names).
                 super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        (db->names).
        super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ._M_impl.super__Vector_impl_data._M_finish = psVar5;
        std::
        allocator_traits<__cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>,4096ul>>
        ::
        destroy<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>>
                  ((short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>
                    *)psVar5,this);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::move_full(&local_b0,
                    (db->names).
                    super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1);
        std::operator+(&local_130,"(",&local_b0);
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
        ::append(&local_130,")(");
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
             *)local_130._M_dataplus._M_p == &local_130.field_2) {
          local_d0.field_2._8_8_ = local_130.field_2._8_8_;
        }
        else {
          local_d0._M_dataplus._M_p = local_130._M_dataplus._M_p;
        }
        local_d0._M_string_length = local_130._M_string_length;
        local_130._M_string_length = 0;
        local_130.field_2._M_local_buf[0] = '\0';
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::operator+(&local_110,&local_d0,&local_90);
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
        ::append(&local_110,")");
        local_70.first._M_string_length = local_110._M_string_length;
        paVar1 = &local_110.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
             *)local_110._M_dataplus._M_p == paVar1) {
          local_e0._8_8_ = local_110.field_2._8_8_;
          local_f0 = &local_e0;
        }
        else {
          local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
                      *)local_110._M_dataplus._M_p;
        }
        local_110._M_string_length = 0;
        local_110.field_2._M_local_buf[0] = '\0';
        local_70.first._M_dataplus._M_p = (pointer)&local_70.first.field_2;
        if (local_f0 == &local_e0) {
          local_70.first.field_2._8_8_ = local_e0._8_8_;
        }
        else {
          local_70.first._M_dataplus._M_p = (pointer)local_f0;
        }
        local_e8 = 0;
        local_e0._M_allocated_capacity =
             (ulong)(uint7)local_110.field_2._M_allocated_capacity._1_7_ << 8;
        local_70.second._M_dataplus._M_p = (pointer)&local_70.second.field_2;
        local_70.second._M_string_length = 0;
        local_70.second.field_2._M_local_buf[0] = '\0';
        psVar5 = (db->names).
                 super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_110._M_dataplus._M_p = (pointer)paVar1;
        local_f0 = &local_e0;
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
        ::operator=(&psVar5[-1].first,&local_70.first);
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
        ::operator=(&psVar5[-1].second,&local_70.second);
        string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
        ::~string_pair(&local_70);
        if (local_f0 != &local_e0) {
          free(local_f0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
             *)local_110._M_dataplus._M_p != paVar1) {
          free(local_110._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          free(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          free(local_130._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          free(local_b0._M_dataplus._M_p);
        }
        first = pcVar6;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          free(local_90._M_dataplus._M_p);
        }
      }
    }
  }
  return first;
}

Assistant:

const char*
parse_conversion_expr(const char* first, const char* last, C& db)
{
    if (last - first >= 3 && first[0] == 'c' && first[1] == 'v')
    {
        bool try_to_parse_template_args = db.try_to_parse_template_args;
        db.try_to_parse_template_args = false;
        const char* t = parse_type(first+2, last, db);
        db.try_to_parse_template_args = try_to_parse_template_args;
        if (t != first+2 && t != last)
        {
            if (*t != '_')
            {
                const char* t1 = parse_expression(t, last, db);
                if (t1 == t)
                    return first;
                t = t1;
            }
            else
            {
                ++t;
                if (t == last)
                    return first;
                if (*t == 'E')
                    db.names.emplace_back();
                else
                {
                    bool first_expr = true;
                    while (*t != 'E')
                    {
                        const char* t1 = parse_expression(t, last, db);
                        if (t1 == t || t1 == last)
                            return first;
                        if (!first_expr)
                        {
                            if (db.names.empty())
                                return first;
                            auto tmp = db.names.back().move_full();
                            db.names.pop_back();
                            if (!tmp.empty())
                            {
                                if (db.names.empty())
                                    return first;
                                db.names.back().first.append(", ");
                                db.names.back().first.append(tmp);
                                first_expr = false;
                            }
                        }
                        t = t1;
                    }
                }
                ++t;
            }
            if (db.names.size() < 2)
                return first;
            auto tmp = db.names.back().move_full();
            db.names.pop_back();
            db.names.back() = "(" + db.names.back().move_full() + ")(" + tmp + ")";
            first = t;
        }
    }
    return first;
}